

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# date_part.cpp
# Opt level: O1

int64_t duckdb::DatePart::MillenniumOperator::Operation<duckdb::dtime_t,long>(dtime_t input)

{
  NotImplementedException *this;
  undefined1 *local_40 [2];
  undefined1 local_30 [16];
  
  this = (NotImplementedException *)__cxa_allocate_exception(0x10);
  local_40[0] = local_30;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_40,"\"time\" units \"millennium\" not recognized","");
  duckdb::NotImplementedException::NotImplementedException(this,(string *)local_40);
  __cxa_throw(this,&NotImplementedException::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

int64_t DatePart::MillenniumOperator::Operation(dtime_t input) {
	throw NotImplementedException("\"time\" units \"millennium\" not recognized");
}